

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

int wally_hex_n_verify(char *hex,size_t hex_len)

{
  size_t sVar1;
  uint uVar2;
  
  if ((hex_len & 1) == 0 && (hex_len != 0 && hex != (char *)0x0)) {
    sVar1 = 0;
    while( true ) {
      if (hex_len == sVar1) {
        return 0;
      }
      if ((9 < (byte)(hex[sVar1] - 0x30U)) &&
         ((uVar2 = (byte)hex[sVar1] - 0x41, 0x25 < uVar2 ||
          ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))) break;
      sVar1 = sVar1 + 1;
    }
  }
  return -2;
}

Assistant:

int wally_hex_n_verify(const char *hex, size_t hex_len)
{
    if (!hex || !hex_len || hex_len & 0x1)
        return WALLY_EINVAL;

    while (hex_len--) {
        char c = *hex++;
        if (!((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')))
            return WALLY_EINVAL;
    }
    return WALLY_OK;
}